

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void raviX_ptrlist_concat(PtrList *a,PtrList **self)

{
  C_MemoryAllocator *ptr_list_allocator;
  void *ptr;
  PtrList *pPVar1;
  PtrListIterator iter;
  PtrListIterator local_30;
  
  local_30.__nr = -1;
  pPVar1 = a;
  if ((a != (PtrList *)0x0) || (pPVar1 = *self, pPVar1 != (PtrList *)0x0)) {
    ptr_list_allocator = pPVar1->allocator_;
    local_30.__head = a;
    local_30.__list = a;
    while( true ) {
      ptr = raviX_ptrlist_iter_next(&local_30);
      if (ptr == (void *)0x0) break;
      raviX_ptrlist_add(self,ptr,ptr_list_allocator);
    }
  }
  return;
}

Assistant:

void raviX_ptrlist_concat(PtrList *a, PtrList **self)
{
	C_MemoryAllocator *alloc = NULL;
	PtrListIterator iter = raviX_ptrlist_forward_iterator(a);
	if (a)
		alloc = a->allocator_;
	else if (*self)
		alloc = (*self)->allocator_;
	else
		return;
	for (void *ptr = raviX_ptrlist_iter_next(&iter); ptr != NULL; ptr = raviX_ptrlist_iter_next(&iter)) {
		raviX_ptrlist_add(self, ptr, alloc);
	}
}